

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

vector<soul::Value,_std::allocator<soul::Value>_> * __thiscall
soul::heart::Parser::parseConstantList
          (vector<soul::Value,_std::allocator<soul::Value>_> *__return_storage_ptr__,Parser *this,
          Type *requiredType,size_t num)

{
  long lVar1;
  Value local_70;
  
  (__return_storage_ptr__->super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::Value,_std::allocator<soul::Value>_>::reserve(__return_storage_ptr__,num);
  if ((long)(__return_storage_ptr__->super__Vector_base<soul::Value,_std::allocator<soul::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->super__Vector_base<soul::Value,_std::allocator<soul::Value>_>).
            _M_impl.super__Vector_impl_data._M_start >> 6 != num) {
    do {
      parseConstant(&local_70,this,requiredType,true);
      std::vector<soul::Value,_std::allocator<soul::Value>_>::emplace_back<soul::Value>
                (__return_storage_ptr__,&local_70);
      soul::Value::~Value(&local_70);
      lVar1 = (long)(__return_storage_ptr__->
                    super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      if ((ulong)(lVar1 >> 6) < num) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x27e596);
        lVar1 = (long)(__return_storage_ptr__->
                      super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<soul::Value,_std::allocator<soul::Value>_>)._M_impl.
                      super__Vector_impl_data._M_start;
      }
    } while (lVar1 >> 6 != num);
  }
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27cf28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Value> parseConstantList (const Type& requiredType, size_t num)
    {
        std::vector<Value> elements;
        elements.reserve (num);

        for (;;)
        {
            if (elements.size() == num)
            {
                expect (HEARTOperator::closeBrace);
                return elements;
            }

            elements.push_back (parseConstant (requiredType, true));

            if (elements.size() < num)
                expect (HEARTOperator::comma);
        }
    }